

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setRootPrePartials
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *stateFrequenciesIndices,
          int count)

{
  double **ppdVar1;
  double *__src;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  int l;
  int iVar5;
  int i;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  iVar4 = -7;
  if ((count == 1) && (this->kAutoRootPartitioningEnabled == false)) {
    lVar7 = (long)*bufferIndices;
    iVar4 = -5;
    if ((-1 < lVar7) && (*bufferIndices < *(int *)&(this->super_BeagleImpl).field_0xc)) {
      ppdVar1 = this->gPartials;
      iVar5 = *stateFrequenciesIndices;
      pdVar2 = ppdVar1[lVar7];
      if (pdVar2 == (double *)0x0) {
        pdVar2 = (double *)malloc((long)this->kPartialsSize << 3);
        ppdVar1[lVar7] = pdVar2;
        pdVar2 = this->gPartials[lVar7];
        if (pdVar2 == (double *)0x0) {
          return -2;
        }
      }
      iVar4 = 0;
      __src = this->gStateFrequencies[iVar5];
      for (iVar5 = 0; iVar5 < this->kCategoryCount; iVar5 = iVar5 + 1) {
        for (iVar6 = 0; iVar6 < this->kPatternCount; iVar6 = iVar6 + 1) {
          memcpy(pdVar2,__src,(ulong)(uint)this->kStateCount << 3);
          pdVar2 = pdVar2 + this->kPartialsPaddedStateCount;
        }
        uVar3 = (this->kPaddedPatternCount - this->kPatternCount) * this->kPartialsPaddedStateCount;
        uVar3 = ~((int)uVar3 >> 0x1f) & uVar3;
        while (bVar8 = uVar3 != 0, uVar3 = uVar3 - 1, bVar8) {
          *pdVar2 = 0.0;
          pdVar2 = pdVar2 + 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setRootPrePartials(const int *bufferIndices,
                                                          const int *stateFrequenciesIndices,
                                                          int count) {
    if (count == 1) {
        // We treat this as a special case so that we don't have convoluted logic
        //      at the end of the loop over patterns
        if (kAutoRootPartitioningEnabled) {
//            calcRootLogLikelihoodsByAutoPartitionAsync(bufferIndices,
//                                                       categoryWeightsIndices,
//                                                       stateFrequenciesIndices,
//                                                       cumulativeScaleIndices,
//                                                       gAutoPartitionIndices,
//                                                       gAutoPartitionOutSumLogLikelihoods);
//
//            *outSumLogLikelihood = 0.0;
//
//            for (int i = 0; i < kPartitionCount; i++) {
//                *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
//            }
//
//            if (*outSumLogLikelihood != *outSumLogLikelihood) {
//                return BEAGLE_ERROR_FLOATING_POINT;
//            } else {
//                return BEAGLE_SUCCESS;
//            }
            return BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {
            int stateFrequenciesIndex = stateFrequenciesIndices[0];
            int bufferIndex = bufferIndices[0];
            if (bufferIndex < 0 || bufferIndex >= kBufferCount)
                return BEAGLE_ERROR_OUT_OF_RANGE;
            if (gPartials[bufferIndex] == NULL) {
                gPartials[bufferIndex] = (REALTYPE *) malloc(sizeof(REALTYPE) * kPartialsSize);
                if (gPartials[bufferIndex] == 0L)
                    return BEAGLE_ERROR_OUT_OF_MEMORY;
            }
            const REALTYPE *inPartialsOffset = gStateFrequencies[stateFrequenciesIndex];
            REALTYPE *tmpRealPartialsOffset = gPartials[bufferIndex];
            for (int l = 0; l < kCategoryCount; l++) {
                for (int i = 0; i < kPatternCount; i++) {
                    beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
                    tmpRealPartialsOffset += kPartialsPaddedStateCount;
                }
                // Pad extra buffer with zeros
                for (int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
                    *tmpRealPartialsOffset++ = 0;
                }
            }

            return BEAGLE_SUCCESS;
        }
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }
    return BEAGLE_ERROR_NO_IMPLEMENTATION;

}